

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

bool testing::internal::LogIsVisible(LogSeverity severity)

{
  bool bVar1;
  undefined7 in_register_00000001;
  undefined4 in_EDI;
  undefined4 unaff_retaddr;
  char *__rhs;
  
  __rhs = (char *)CONCAT44((int)((uint7)in_register_00000001 >> 0x18),in_EDI);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(unaff_retaddr,severity),__rhs);
  if (bVar1) {
    bVar1 = true;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(unaff_retaddr,severity),__rhs);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      bVar1 = (int)__rhs == 1;
    }
  }
  return bVar1;
}

Assistant:

GTEST_API_ bool LogIsVisible(LogSeverity severity) {
  if (GMOCK_FLAG(verbose) == kInfoVerbosity) {
    // Always show the log if --gmock_verbose=info.
    return true;
  } else if (GMOCK_FLAG(verbose) == kErrorVerbosity) {
    // Always hide it if --gmock_verbose=error.
    return false;
  } else {
    // If --gmock_verbose is neither "info" nor "error", we treat it
    // as "warning" (its default value).
    return severity == kWarning;
  }
}